

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O0

void __thiscall VulkanUtilities::RenderingInfoWrapper::ResetClears(RenderingInfoWrapper *this)

{
  Char *Message;
  type pVVar1;
  uint uVar2;
  VkClearDepthStencilValue local_54;
  undefined8 local_4c;
  undefined1 local_38 [8];
  string msg;
  uint32_t Idx;
  uint32_t Bit;
  RenderingInfoWrapper *this_local;
  
  while (this->m_AttachmentClearMask != 0) {
    msg.field_2._12_4_ = Diligent::ExtractLSB<unsigned_int>(&this->m_AttachmentClearMask);
    msg.field_2._8_4_ = Diligent::LinuxMisc::GetLSB(msg.field_2._12_4_);
    uVar2 = (this->m_RI).colorAttachmentCount +
            (uint)((this->m_RI).pDepthAttachment != (VkRenderingAttachmentInfo *)0x0) +
            (uint)((this->m_RI).pStencilAttachment != (VkRenderingAttachmentInfo *)0x0);
    if (uVar2 <= (uint)msg.field_2._8_4_) {
      Diligent::FormatString<char[26],char[124]>
                ((string *)local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Idx < m_RI.colorAttachmentCount + (m_RI.pDepthAttachment != nullptr ? 1 : 0) + (m_RI.pStencilAttachment != nullptr ? 1 : 0)"
                 ,(char (*) [124])(ulong)uVar2);
      Message = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (Message,"ResetClears",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
                 ,0x5e);
      std::__cxx11::string::~string((string *)local_38);
    }
    pVVar1 = std::
             unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ::operator[](&this->m_Attachments,(ulong)(uint)msg.field_2._8_4_);
    pVVar1->loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    memset(&local_54,0,0x10);
    pVVar1 = std::
             unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
             ::operator[](&this->m_Attachments,(ulong)(uint)msg.field_2._8_4_);
    (pVVar1->clearValue).depthStencil = local_54;
    *(undefined8 *)((long)&pVVar1->clearValue + 8) = local_4c;
  }
  return;
}

Assistant:

void RenderingInfoWrapper::ResetClears()
{
    while (m_AttachmentClearMask != 0)
    {
        uint32_t Bit = Diligent::ExtractLSB(m_AttachmentClearMask);
        uint32_t Idx = Diligent::PlatformMisc::GetLSB(Bit);
        VERIFY_EXPR(Idx < m_RI.colorAttachmentCount + (m_RI.pDepthAttachment != nullptr ? 1 : 0) + (m_RI.pStencilAttachment != nullptr ? 1 : 0));
        m_Attachments[Idx].loadOp     = VK_ATTACHMENT_LOAD_OP_LOAD;
        m_Attachments[Idx].clearValue = {};
    }
}